

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::internal_lower_bound<int>
          (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
           *this,int *key)

{
  btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *this_00;
  bool bVar1;
  SearchResult<int,_false> SVar2;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_> *pbVar3;
  template_ElementType<3UL> *ppbVar4;
  undefined8 extraout_RDX;
  iterator iVar6;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  bVar5;
  
  pbVar3 = this;
  while( true ) {
    this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
               *)(pbVar3->root_).
                 super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                 ._M_head_impl;
    SVar2 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
            linear_search<int,phmap::Less<int>>(this_00,key,(Less<int> *)this);
    bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            ::leaf((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                    *)this_00);
    if (bVar1) break;
    ppbVar4 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
              ::GetField<3ul>(this_00);
    pbVar3 = (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
              *)(ppbVar4 + SVar2.value);
  }
  bVar5.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)(ulong)(uint)SVar2.value;
  bVar5._8_8_ = extraout_RDX;
  bVar5 = btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
          internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
                    ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                      *)this_00,bVar5);
  iVar6.node = bVar5.node;
  iVar6.position = bVar5.position;
  iVar6._12_4_ = bVar5._12_4_;
  return iVar6;
}

Assistant:

auto btree<P>::internal_lower_bound(const K &key) const -> iterator {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            iter.position = iter.node->lower_bound(key, key_comp()).value;
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return internal_last(iter);
    }